

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2::SharedDtor
               (MessageLite *self)

{
  TestAllTypesLite *this;
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *)self;
  google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
            (&self->_internal_metadata_);
  pAVar1 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    this = (TestAllTypesLite *)local_18[1]._internal_metadata_.ptr_;
    if (this != (TestAllTypesLite *)0x0) {
      TestAllTypesLite::~TestAllTypesLite(this);
      operator_delete(this,0x348);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
             ,0x1c90,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestParsingMergeLite_RepeatedFieldsGenerator_Group2::SharedDtor(MessageLite& self) {
  TestParsingMergeLite_RepeatedFieldsGenerator_Group2& this_ = static_cast<TestParsingMergeLite_RepeatedFieldsGenerator_Group2&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.field1_;
  this_._impl_.~Impl_();
}